

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall QMakeParser::putOperator(QMakeParser *this,ushort **tokPtr)

{
  ushort *puVar1;
  ushort **tokPtr_local;
  QMakeParser *this_local;
  
  if (this->m_operator == AndOperator) {
    if (this->m_state == StCond) {
      puVar1 = *tokPtr;
      *tokPtr = puVar1 + 1;
      *puVar1 = 0x16;
    }
    this->m_operator = NoOperator;
  }
  else if (this->m_operator == OrOperator) {
    puVar1 = *tokPtr;
    *tokPtr = puVar1 + 1;
    *puVar1 = 0x17;
    this->m_operator = NoOperator;
  }
  return;
}

Assistant:

void QMakeParser::putOperator(ushort *&tokPtr)
{
    if (m_operator== AndOperator) {
        // A colon must be used after else and for() if no brace is used,
        // but in this case it is obviously not a binary operator.
        if (m_state == StCond)
            putTok(tokPtr, TokAnd);
        m_operator = NoOperator;
    } else if (m_operator == OrOperator) {
        putTok(tokPtr, TokOr);
        m_operator = NoOperator;
    }
}